

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall punky::par::Parser::peek_error(Parser *this,TokenType *type)

{
  TokenType *in_RDX;
  TokenType *type_00;
  string local_e8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TokenType *local_18;
  TokenType *type_local;
  Parser *this_local;
  
  local_18 = type;
  type_local = (TokenType *)this;
  punky::tok::type_to_string_abi_cxx11_(&local_b8,(tok *)type,in_RDX);
  std::operator+(&local_98,"Expected next token to be ",&local_b8);
  std::operator+(&local_78,&local_98,", but got ");
  punky::tok::type_to_string_abi_cxx11_(&local_e8,(tok *)&this->m_peek_tok,type_00);
  std::operator+(&local_58,&local_78,&local_e8);
  std::operator+(&local_38,&local_58," instead");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_errors,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void Parser::peek_error(const TokenType& type)
{
    m_errors.emplace_back("Expected next token to be "
                          + tok::type_to_string(type)
                          + ", but got "
                          + tok::type_to_string(m_peek_tok.m_type)
                          + " instead");
}